

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O3

_Bool chck_buffer_resize(chck_buffer *buf,size_t size)

{
  byte local_9;
  
  if (buf != (chck_buffer *)0x0) {
    chck_buffer_resize_cold_1();
    return (_Bool)(local_9 & 1);
  }
  __assert_fail("buf",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/buffer.c"
                ,0x94,"_Bool chck_buffer_resize(struct chck_buffer *, size_t)");
}

Assistant:

bool
chck_buffer_resize(struct chck_buffer *buf, size_t size)
{
   assert(buf);

   if (unlikely(size == buf->size))
      return true;

   if (unlikely(size == 0)) {
      chck_buffer_flush(buf);
      return true;
   }

   uint8_t *tmp;
   if (!(tmp = realloc((buf->copied ? buf->buffer : NULL), size)))
      return false;

   /* set new buffer position */
   if (buf->curpos - buf->buffer > (ptrdiff_t)size) {
      buf->curpos = tmp + (buf->size - size);
   } else {
      buf->curpos = tmp + (buf->curpos - buf->buffer);
   }

   buf->size = size;
   buf->buffer = tmp;
   buf->copied = true;
   return true;
}